

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

bool __thiscall higan::HttpContext::ParseRequest(HttpContext *this,Buffer *buffer)

{
  HttpRequestParseStatus HVar1;
  char *begin;
  size_t sVar2;
  
  do {
    while( true ) {
      begin = Buffer::ReadBegin(buffer);
      sVar2 = Buffer::ReadableSize(buffer);
      HVar1 = this->status_;
      if (HVar1 != PARSE_FIRST_LINE) break;
      sVar2 = ParseFirstLine(this,begin,begin + sVar2);
LAB_001233a8:
      if (sVar2 == 0xffffffffffffffff) {
        return false;
      }
      Buffer::AddReadIndex(buffer,sVar2);
    }
    if (HVar1 == PARSE_HEADERS) {
      sVar2 = ParseHeader(this,begin,begin + sVar2);
      goto LAB_001233a8;
    }
    if (HVar1 == PARSE_ALL) {
      HttpRequest::AppendBody(&this->request_,begin,begin + sVar2);
      Buffer::Reset(buffer);
      return true;
    }
  } while( true );
}

Assistant:

bool HttpContext::ParseRequest(Buffer* buffer)
{
	bool result_ok = true;

	while (true)
	{
		const char* data = buffer->ReadBegin();
		size_t len = buffer->ReadableSize();

		if (status_ == PARSE_FIRST_LINE)
		{
			ssize_t p_len = ParseFirstLine(data, data + len);
			if (p_len == -1)
			{
				result_ok = false;
				break;
			}
			buffer->AddReadIndex(p_len);
		}
		else if (status_ == PARSE_HEADERS)
		{
			ssize_t p_len = ParseHeader(data, data + len);
			if (p_len == -1)
			{
				result_ok = false;
				break;;
			}
			buffer->AddReadIndex(p_len);
		}
		else if (status_ == PARSE_ALL)
		{
			request_.AppendBody(data, data + len);
			buffer->Reset();
			break;
		}
	}
	return result_ok;
}